

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Struct.cpp
# Opt level: O0

void __thiscall soul::Structure::addMember(Structure *this,Type *type,string *memberName)

{
  bool bVar1;
  Structure *this_00;
  size_t sVar2;
  mapped_type *pmVar3;
  bool local_b1;
  Member local_b0;
  byte local_69;
  Type local_68;
  byte local_39;
  undefined1 local_38 [24];
  string *local_20;
  string *memberName_local;
  Type *type_local;
  Structure *this_local;
  
  local_20 = memberName;
  memberName_local = (string *)type;
  type_local = (Type *)this;
  local_38._8_16_ = std::__cxx11::string::operator_cast_to_basic_string_view((string *)memberName);
  bVar1 = hasMemberWithName(this,(string_view)local_38._8_16_);
  checkAssertion((bool)((bVar1 ^ 0xffU) & 1),"! hasMemberWithName (memberName)","addMember",0x2a);
  bVar1 = Type::isStruct(type);
  local_39 = 0;
  local_69 = 0;
  local_b1 = false;
  if (bVar1) {
    Type::getStruct((Type *)local_38);
    local_39 = 1;
    this_00 = RefCountedPtr<soul::Structure>::operator->((RefCountedPtr<soul::Structure> *)local_38)
    ;
    Type::createStruct(&local_68,this);
    local_69 = 1;
    local_b1 = containsMemberOfType(this_00,&local_68,true);
  }
  checkAssertion((bool)(~local_b1 & 1),
                 "! (type.isStruct() && type.getStruct()->containsMemberOfType (Type::createStruct (*this), true))"
                 ,"addMember",0x2d);
  if ((local_69 & 1) != 0) {
    Type::~Type(&local_68);
  }
  if ((local_39 & 1) != 0) {
    RefCountedPtr<soul::Structure>::~RefCountedPtr((RefCountedPtr<soul::Structure> *)local_38);
  }
  sVar2 = ArrayWithPreallocation<soul::Structure::Member,_8UL>::size(&this->members);
  pmVar3 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
           ::operator[](&this->memberIndexMap,memberName);
  *pmVar3 = sVar2;
  Type::Type(&local_b0.type,type);
  std::__cxx11::string::string((string *)&local_b0.name,(string *)memberName);
  local_b0.readWriteCount.numReads = 0;
  local_b0.readWriteCount.numWrites = 0;
  ArrayWithPreallocation<soul::Structure::Member,_8UL>::push_back(&this->members,&local_b0);
  Member::~Member(&local_b0);
  return;
}

Assistant:

void Structure::addMember (Type type, std::string memberName)
{
    SOUL_ASSERT (! hasMemberWithName (memberName));

    // Ensure we won't create a recursive structure (one containing itself) if we add a member of this type
    SOUL_ASSERT (! (type.isStruct() && type.getStruct()->containsMemberOfType (Type::createStruct (*this), true)));

    memberIndexMap[memberName] = members.size();
    members.push_back ({ std::move (type), std::move (memberName) });

}